

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Thread::~Thread(Thread *this)

{
  set<wabt::interp::Thread_*,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
  *this_00;
  Thread *local_18;
  Thread *local_10;
  Thread *this_local;
  
  local_10 = this;
  this_00 = Store::threads(this->store_);
  local_18 = this;
  std::
  set<wabt::interp::Thread_*,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
  ::erase(this_00,&local_18);
  std::
  unique_ptr<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
  ::~unique_ptr(&this->trace_source_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector(&this->exceptions_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->refs_);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&this->values_);
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector(&this->frames_);
  return;
}

Assistant:

Thread::~Thread() {
  store_.threads().erase(this);
}